

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  bool bVar1;
  iterator iVar2;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  FileDescriptor *file_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = &bStack_b8;
  FilePath_abi_cxx11_(&local_38,(objectivec *)file,(FileDescriptor *)header_extension);
  bVar1 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar1) {
    FilePathBasename_abi_cxx11_(&local_98,(objectivec *)file,file_00);
    std::operator+(&bStack_b8,&local_98,header_extension);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->protobuf_framework_imports_,&bStack_b8);
    std::__cxx11::string::~string((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&bStack_b8,&local_38,header_extension);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->protobuf_non_framework_imports_,&bStack_b8);
    this_00 = &bStack_b8;
  }
  else {
    if (this->need_to_parse_mapping_file_ == true) {
      ParseFrameworkMappings(this);
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->proto_file_to_framework_name_)._M_t,*(key_type **)file);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header) {
      if ((this->generate_for_named_framework_)._M_string_length == 0) {
        std::operator+(&bStack_b8,&local_38,header_extension);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->other_imports_,&bStack_b8);
        goto LAB_00261c83;
      }
      std::operator+(&local_58,&this->generate_for_named_framework_,"/");
      FilePathBasename_abi_cxx11_(&local_78,(objectivec *)file,file_02);
      std::operator+(&local_98,&local_58,&local_78);
      std::operator+(&bStack_b8,&local_98,header_extension);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&bStack_b8);
    }
    else {
      std::operator+(&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (iVar2._M_node + 2),"/");
      FilePathBasename_abi_cxx11_(&local_78,(objectivec *)file,file_01);
      std::operator+(&local_98,&local_58,&local_78);
      std::operator+(&bStack_b8,&local_98,header_extension);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&bStack_b8);
    }
    std::__cxx11::string::~string((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_58;
  }
LAB_00261c83:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const string& header_extension) {
  const string file_path(FilePath(file));

  if (IsProtobufLibraryBundledProtoFile(file)) {
    protobuf_framework_imports_.push_back(
        FilePathBasename(file) + header_extension);
    protobuf_non_framework_imports_.push_back(file_path + header_extension);
    return;
  }

  // Lazy parse any mappings.
  if (need_to_parse_mapping_file_) {
    ParseFrameworkMappings();
  }

  map<string, string>::iterator proto_lookup =
      proto_file_to_framework_name_.find(file->name());
  if (proto_lookup != proto_file_to_framework_name_.end()) {
    other_framework_imports_.push_back(
        proto_lookup->second + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        generate_for_named_framework_ + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  other_imports_.push_back(file_path + header_extension);
}